

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

matd_t * matd_inverse(matd_t *x)

{
  matd_t mVar1;
  uint uVar2;
  uint uVar3;
  matd_t *pmVar4;
  matd_plu_t *mlu;
  matd_t *pmVar5;
  double dVar6;
  
  if (x == (matd_t *)0x0) {
    __assert_fail("x != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x1e4,"matd_t *matd_inverse(const matd_t *)");
  }
  uVar2 = x->nrows;
  if (uVar2 != x->ncols) {
    __assert_fail("x->nrows == x->ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x1e5,"matd_t *matd_inverse(const matd_t *)");
  }
  if (uVar2 < 2) {
    mVar1 = x[1];
    if (((double)mVar1 != 0.0) || (NAN((double)mVar1))) {
      pmVar4 = matd_create_scalar(1.0 / (double)mVar1);
      return pmVar4;
    }
  }
  else {
    if (uVar2 != 2) {
      mlu = matd_plu(x);
      if (mlu->singular == 0) {
        pmVar4 = matd_identity(x->nrows);
        pmVar5 = matd_plu_solve(mlu,pmVar4);
        free(pmVar4);
      }
      else {
        pmVar5 = (matd_t *)0x0;
      }
      matd_plu_destroy(mlu);
      return pmVar5;
    }
    dVar6 = (double)x[1] * (double)x[4] - (double)x[3] * (double)x[2];
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      dVar6 = 1.0 / dVar6;
      pmVar4 = matd_create(2,2);
      uVar2 = x->ncols;
      mVar1 = x[2];
      pmVar4[1] = (matd_t)((double)x[(ulong)(uVar2 + 1) + 1] * dVar6);
      pmVar4[2] = (matd_t)(-(double)mVar1 * dVar6);
      uVar3 = pmVar4->ncols;
      pmVar4[(ulong)uVar3 + 1] = (matd_t)(-(double)x[(ulong)uVar2 + 1] * dVar6);
      pmVar4[(ulong)(uVar3 + 1) + 1] = (matd_t)(dVar6 * (double)x[1]);
      return pmVar4;
    }
  }
  return (matd_t *)0x0;
}

Assistant:

matd_t *matd_inverse(const matd_t *x)
{
    matd_t *m = NULL;

    assert(x != NULL);
    assert(x->nrows == x->ncols);

    if (matd_is_scalar(x)) {
        if (x->data[0] == 0)
            return NULL;

        return matd_create_scalar(1.0 / x->data[0]);
    }

    switch(x->nrows) {
        case 1: {
            double det = x->data[0];
            if (det == 0)
                return NULL;

            double invdet = 1.0 / det;

            m = matd_create(x->nrows, x->nrows);
            MATD_EL(m, 0, 0) = 1.0 * invdet;
            return m;
        }

        case 2: {
            double det = x->data[0] * x->data[3] - x->data[1] * x->data[2];
            if (det == 0)
                return NULL;

            double invdet = 1.0 / det;

            m = matd_create(x->nrows, x->nrows);
            MATD_EL(m, 0, 0) = MATD_EL(x, 1, 1) * invdet;
            MATD_EL(m, 0, 1) = - MATD_EL(x, 0, 1) * invdet;
            MATD_EL(m, 1, 0) = - MATD_EL(x, 1, 0) * invdet;
            MATD_EL(m, 1, 1) = MATD_EL(x, 0, 0) * invdet;
            return m;
        }

        default: {
            matd_plu_t *plu = matd_plu(x);

            matd_t *inv = NULL;
            if (!plu->singular) {
                matd_t *ident = matd_identity(x->nrows);
                inv = matd_plu_solve(plu, ident);
                matd_destroy(ident);
            }

            matd_plu_destroy(plu);

            return inv;
        }
    }

    return NULL; // unreachable
}